

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor,sqlite_int64 *pRowid)

{
  int iVar1;
  RtreeNode *pRVar2;
  i64 iVar3;
  sqlite3_vtab *psVar4;
  int rc;
  int local_2c;
  
  if (*(char *)((long)&pVtabCursor[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&pVtabCursor[4].pVtab + 4) == 0) {
      psVar4 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar4 = pVtabCursor[6].pVtab;
    }
  }
  else {
    psVar4 = (sqlite3_vtab *)(pVtabCursor + 8);
  }
  local_2c = 0;
  pRVar2 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)pVtabCursor,&local_2c);
  iVar1 = local_2c;
  if (psVar4 != (sqlite3_vtab *)0x0 && local_2c == 0) {
    iVar3 = readInt64(pRVar2->zData +
                      (ulong)(byte)pVtabCursor->pVtab[1].field_0xf *
                      (ulong)*(byte *)((long)&psVar4->zErrMsg + 2) + 4);
    *pRowid = iVar3;
  }
  return iVar1;
}

Assistant:

static int rtreeRowid(sqlite3_vtab_cursor *pVtabCursor, sqlite_int64 *pRowid){
  RtreeCursor *pCsr = (RtreeCursor *)pVtabCursor;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);
  if( rc==SQLITE_OK && p ){
    *pRowid = nodeGetRowid(RTREE_OF_CURSOR(pCsr), pNode, p->iCell);
  }
  return rc;
}